

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

uvec4 ImageCodec::decodeUINT_UINTPacked<unsigned_char>(ImageCodec *codec,void *ptr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pointer pSVar4;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 aVar5;
  uint *puVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_48;
  
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  lVar8 = 8;
  for (uVar7 = 0;
      pSVar4 = (codec->packedSampleInfo).
               super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(codec->packedSampleInfo).
                             super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0xc);
      uVar7 = uVar7 + 1) {
    bVar1 = *(byte *)((long)ptr + (ulong)*(uint *)((long)pSVar4 + lVar8 + -8));
    bVar2 = *(byte *)((long)pSVar4 + lVar8 + -4);
    bVar3 = *(byte *)((long)&pSVar4->elementIndex + lVar8);
    puVar6 = glm::vec<4,_unsigned_int,_(glm::precision)0>::operator[]
                       ((vec<4,_unsigned_int,_(glm::precision)0> *)&local_48.field_0,
                        (length_type)uVar7);
    *puVar6 = ~(-1 << (bVar3 & 0x1f)) & (uint)(bVar1 >> (bVar2 & 0x1f));
    lVar8 = lVar8 + 0xc;
  }
  aVar5._8_8_ = local_48._8_8_;
  aVar5._0_8_ = local_48._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)aVar5.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            result[static_cast<glm::length_t>(i)] = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
        }
        return result;
    }